

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_InitFont(stbtt_fontinfo *info,uchar *data2,int fontstart)

{
  uint uVar1;
  stbtt_uint16 sVar2;
  stbtt_uint16 sVar3;
  stbtt_uint32 sVar4;
  stbtt_uint32 sVar5;
  stbtt_uint32 encoding_record;
  stbtt_int32 numTables;
  stbtt_int32 i;
  stbtt_uint32 t;
  stbtt_uint32 cmap;
  stbtt_uint8 *data;
  int fontstart_local;
  uchar *data2_local;
  stbtt_fontinfo *info_local;
  
  info->data = data2;
  info->fontstart = fontstart;
  sVar4 = stbtt__find_table(data2,fontstart,"cmap");
  sVar5 = stbtt__find_table(data2,fontstart,"loca");
  info->loca = sVar5;
  sVar5 = stbtt__find_table(data2,fontstart,"head");
  info->head = sVar5;
  sVar5 = stbtt__find_table(data2,fontstart,"glyf");
  info->glyf = sVar5;
  sVar5 = stbtt__find_table(data2,fontstart,"hhea");
  info->hhea = sVar5;
  sVar5 = stbtt__find_table(data2,fontstart,"hmtx");
  info->hmtx = sVar5;
  sVar5 = stbtt__find_table(data2,fontstart,"kern");
  info->kern = sVar5;
  if (((((sVar4 == 0) || (info->loca == 0)) || (info->head == 0)) ||
      ((info->glyf == 0 || (info->hhea == 0)))) || (info->hmtx == 0)) {
    info_local._4_4_ = 0;
  }
  else {
    sVar5 = stbtt__find_table(data2,fontstart,"maxp");
    if (sVar5 == 0) {
      info->numGlyphs = 0xffff;
    }
    else {
      sVar2 = ttUSHORT(data2 + (ulong)sVar5 + 4);
      info->numGlyphs = (uint)sVar2;
    }
    sVar2 = ttUSHORT(data2 + (ulong)sVar4 + 2);
    info->index_map = 0;
    for (encoding_record = 0; (int)encoding_record < (int)(uint)sVar2;
        encoding_record = encoding_record + 1) {
      uVar1 = sVar4 + 4 + encoding_record * 8;
      sVar3 = ttUSHORT(data2 + uVar1);
      if (sVar3 == 0) {
        sVar5 = ttULONG(data2 + (ulong)uVar1 + 4);
        info->index_map = sVar4 + sVar5;
      }
      else if ((sVar3 == 3) &&
              ((sVar3 = ttUSHORT(data2 + (ulong)uVar1 + 2), sVar3 == 1 || (sVar3 == 10)))) {
        sVar5 = ttULONG(data2 + (ulong)uVar1 + 4);
        info->index_map = sVar4 + sVar5;
      }
    }
    if (info->index_map == 0) {
      info_local._4_4_ = 0;
    }
    else {
      sVar2 = ttUSHORT(data2 + (long)info->head + 0x32);
      info->indexToLocFormat = (uint)sVar2;
      info_local._4_4_ = 1;
    }
  }
  return info_local._4_4_;
}

Assistant:

STBTT_DEF int stbtt_InitFont(stbtt_fontinfo *info, const unsigned char *data2, int fontstart)
{
   stbtt_uint8 *data = (stbtt_uint8 *) data2;
   stbtt_uint32 cmap, t;
   stbtt_int32 i,numTables;

   info->data = data;
   info->fontstart = fontstart;

   cmap = stbtt__find_table(data, fontstart, "cmap");       // required
   info->loca = stbtt__find_table(data, fontstart, "loca"); // required
   info->head = stbtt__find_table(data, fontstart, "head"); // required
   info->glyf = stbtt__find_table(data, fontstart, "glyf"); // required
   info->hhea = stbtt__find_table(data, fontstart, "hhea"); // required
   info->hmtx = stbtt__find_table(data, fontstart, "hmtx"); // required
   info->kern = stbtt__find_table(data, fontstart, "kern"); // not required
   if (!cmap || !info->loca || !info->head || !info->glyf || !info->hhea || !info->hmtx)
      return 0;

   t = stbtt__find_table(data, fontstart, "maxp");
   if (t)
      info->numGlyphs = ttUSHORT(data+t+4);
   else
      info->numGlyphs = 0xffff;

   // find a cmap encoding table we understand *now* to avoid searching
   // later. (todo: could make this installable)
   // the same regardless of glyph.
   numTables = ttUSHORT(data + cmap + 2);
   info->index_map = 0;
   for (i=0; i < numTables; ++i) {
      stbtt_uint32 encoding_record = cmap + 4 + 8 * i;
      // find an encoding we understand:
      switch(ttUSHORT(data+encoding_record)) {
         case STBTT_PLATFORM_ID_MICROSOFT:
            switch (ttUSHORT(data+encoding_record+2)) {
               case STBTT_MS_EID_UNICODE_BMP:
               case STBTT_MS_EID_UNICODE_FULL:
                  // MS/Unicode
                  info->index_map = cmap + ttULONG(data+encoding_record+4);
                  break;
            }
            break;
        case STBTT_PLATFORM_ID_UNICODE:
            // Mac/iOS has these
            // all the encodingIDs are unicode, so we don't bother to check it
            info->index_map = cmap + ttULONG(data+encoding_record+4);
            break;
      }
   }
   if (info->index_map == 0)
      return 0;

   info->indexToLocFormat = ttUSHORT(data+info->head + 50);
   return 1;
}